

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry(Decoder *this,DecoderBuffer *in_buffer,Mesh *out_geometry)

{
  bool bVar1;
  Decoder *in_RDI;
  Status *_local_status;
  Mesh *in_stack_00000098;
  DecoderBuffer *in_stack_000000a0;
  Decoder *in_stack_000000a8;
  Decoder *this_00;
  
  this_00 = in_RDI;
  DecodeBufferToGeometryStep1(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    Status::~Status((Status *)0x153ba2);
    DecodeBufferToGeometryStep2(this_00);
    bVar1 = Status::ok((Status *)in_RDI);
    if (bVar1) {
      Status::~Status((Status *)0x153c21);
      OkStatus();
    }
  }
  return (Status *)in_RDI;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       Mesh *out_geometry) {
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometryStep1(in_buffer,out_geometry))
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometryStep2())
  return OkStatus();
}